

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O1

bool testFromCharArray(String *str)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  bool bVar4;
  int iVar5;
  String substr;
  String local_30;
  
  if ((str->view_)._M_str == "abc") {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str_const.data() != charArray) failed on line ",
               0x3a);
    iVar5 = 0x68;
LAB_001cd993:
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    return false;
  }
  if ((str->view_)._M_len != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(str_const.size() == sizeof(charArray) - 1) failed on line ",0x46);
    iVar5 = 0x69;
    goto LAB_001cd993;
  }
  bVar1 = cm::String::is_stable(str);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str_const.is_stable()) failed on line ",0x32);
    iVar5 = 0x6a;
    goto LAB_001cd993;
  }
  pcVar2 = cm::String::c_str(str);
  if (pcVar2 == "abc") {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.c_str() != charArray) failed on line ",0x35);
    iVar5 = 0x6b;
    goto LAB_001cd993;
  }
  bVar1 = cm::String::is_stable(str);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.is_stable()) failed on line ",0x2c);
    iVar5 = 0x6c;
    goto LAB_001cd993;
  }
  cm::String::substr(&local_30,str,1,0xffffffffffffffff);
  if (local_30.view_._M_str == "bc") {
    iVar5 = 0x6f;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(substr_const.data() != &charArray[1]) failed on line ",0x41);
  }
  else if (local_30.view_._M_len == 2) {
    bVar1 = cm::String::is_stable(&local_30);
    if (bVar1) {
      iVar5 = 0x71;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!substr_const.is_stable()) failed on line ",0x36
                );
    }
    else {
      pcVar2 = cm::String::c_str(&local_30);
      if (pcVar2 == "bc") {
        iVar5 = 0x72;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(substr.c_str() != &charArray[1]) failed on line ",0x3c);
      }
      else {
        bVar1 = cm::String::is_stable(&local_30);
        bVar4 = true;
        if (!bVar1) goto LAB_001cda18;
        iVar5 = 0x73;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(!substr.is_stable()) failed on line ",0x30);
      }
    }
  }
  else {
    iVar5 = 0x70;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(substr_const.size() == 2) failed on line ",0x35);
  }
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  bVar4 = false;
LAB_001cda18:
  if (local_30.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return bVar4;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_30.string_.
             super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  return bVar4;
}

Assistant:

static bool testFromCharArray(cm::String str)
{
  cm::String const& str_const = str;
  ASSERT_TRUE(str_const.data() != charArray);
  ASSERT_TRUE(str_const.size() == sizeof(charArray) - 1);
  ASSERT_TRUE(str_const.is_stable());
  ASSERT_TRUE(str.c_str() != charArray);
  ASSERT_TRUE(str.is_stable());
  cm::String substr = str.substr(1);
  cm::String const& substr_const = substr;
  ASSERT_TRUE(substr_const.data() != &charArray[1]);
  ASSERT_TRUE(substr_const.size() == 2);
  ASSERT_TRUE(!substr_const.is_stable());
  ASSERT_TRUE(substr.c_str() != &charArray[1]);
  ASSERT_TRUE(!substr.is_stable());
  return true;
}